

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

BPMNode * bpmnode_create(BPMLists *lists,int weight,uint index,BPMNode *tail)

{
  uint uVar1;
  BPMNode *pBVar2;
  uint uVar3;
  uint uVar4;
  BPMNode **ppBVar5;
  
  uVar3 = lists->nextfree;
  if (lists->numfree <= uVar3) {
    for (uVar3 = 0; uVar3 != lists->memsize; uVar3 = uVar3 + 1) {
      lists->memory[uVar3].in_use = 0;
    }
    for (uVar3 = 0; uVar3 != lists->listsize; uVar3 = uVar3 + 1) {
      ppBVar5 = lists->chains0 + uVar3;
      while (pBVar2 = *ppBVar5, pBVar2 != (BPMNode *)0x0) {
        pBVar2->in_use = 1;
        ppBVar5 = &pBVar2->tail;
      }
      ppBVar5 = lists->chains1 + uVar3;
      while (pBVar2 = *ppBVar5, pBVar2 != (BPMNode *)0x0) {
        pBVar2->in_use = 1;
        ppBVar5 = &pBVar2->tail;
      }
    }
    lists->numfree = 0;
    uVar3 = 0;
    for (uVar4 = 0; uVar4 != lists->memsize; uVar4 = uVar4 + 1) {
      if (lists->memory[uVar4].in_use == 0) {
        uVar1 = lists->numfree;
        lists->numfree = uVar1 + 1;
        lists->freelist[uVar1] = lists->memory + uVar4;
      }
    }
  }
  lists->nextfree = uVar3 + 1;
  pBVar2 = lists->freelist[uVar3];
  pBVar2->weight = weight;
  pBVar2->index = index;
  pBVar2->tail = tail;
  return pBVar2;
}

Assistant:

static BPMNode* bpmnode_create(BPMLists* lists, int weight, unsigned index, BPMNode* tail)
{
	unsigned i;
	BPMNode* result;

	/*memory full, so garbage collect*/
	if (lists->nextfree >= lists->numfree)
	{
		/*mark only those that are in use*/
		for (i = 0; i != lists->memsize; ++i) lists->memory[i].in_use = 0;
		for (i = 0; i != lists->listsize; ++i)
		{
			BPMNode* node;
			for (node = lists->chains0[i]; node != 0; node = node->tail) node->in_use = 1;
			for (node = lists->chains1[i]; node != 0; node = node->tail) node->in_use = 1;
		}
		/*collect those that are free*/
		lists->numfree = 0;
		for (i = 0; i != lists->memsize; ++i)
		{
			if (!lists->memory[i].in_use) lists->freelist[lists->numfree++] = &lists->memory[i];
		}
		lists->nextfree = 0;
	}

	result = lists->freelist[lists->nextfree++];
	result->weight = weight;
	result->index = index;
	result->tail = tail;
	return result;
}